

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetScaling_Test::~OsqpTest_GetScaling_Test
          (OsqpTest_GetScaling_Test *this)

{
  OsqpTest_GetScaling_Test *this_local;
  
  ~OsqpTest_GetScaling_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetScaling) {
  OsqpSettings settings;
  settings.scaling = 23;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  const auto scaling = solver.GetScaling();
  ASSERT_TRUE(scaling.ok());
  EXPECT_EQ(*scaling, 23);
}